

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O2

void test_inflate(Byte *compr,uLong comprLen,Byte *uncompr,uLong uncomprLen)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  Byte *local_98;
  undefined4 local_90;
  ulong local_88;
  Byte *local_80;
  undefined4 local_78;
  ulong local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  
  builtin_memcpy(uncompr,"garbage",8);
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  local_90 = 0;
  local_98 = compr;
  local_80 = uncompr;
  uVar1 = inflateInit_(&local_98,"1.2.8",0x70);
  if (uVar1 == 0) {
    do {
      if ((uncomprLen <= local_70) || (comprLen <= local_88)) goto LAB_00102908;
      local_90 = 1;
      local_78 = local_90;
      uVar1 = inflate(&local_98,0);
    } while (uVar1 == 0);
    if (uVar1 == 1) {
LAB_00102908:
      uVar1 = inflateEnd(&local_98);
      if (uVar1 == 0) {
        iVar2 = strcmp((char *)uncompr,hello);
        if (iVar2 == 0) {
          printf("inflate(): %s\n",uncompr);
          return;
        }
        fwrite("bad inflate\n",0xc,1,_stderr);
        goto LAB_00102966;
      }
      pcVar3 = "inflateEnd";
    }
    else {
      pcVar3 = "inflate";
    }
  }
  else {
    pcVar3 = "inflateInit";
  }
  fprintf(_stderr,"%s error: %d\n",pcVar3,(ulong)uVar1);
LAB_00102966:
  exit(1);
}

Assistant:

void test_inflate(compr, comprLen, uncompr, uncomprLen)
    Byte *compr, *uncompr;
    uLong comprLen, uncomprLen;
{
    int err;
    z_stream d_stream; /* decompression stream */

    strcpy((char*)uncompr, "garbage");

    d_stream.zalloc = zalloc;
    d_stream.zfree = zfree;
    d_stream.opaque = (voidpf)0;

    d_stream.next_in  = compr;
    d_stream.avail_in = 0;
    d_stream.next_out = uncompr;

    err = inflateInit(&d_stream);
    CHECK_ERR(err, "inflateInit");

    while (d_stream.total_out < uncomprLen && d_stream.total_in < comprLen) {
        d_stream.avail_in = d_stream.avail_out = 1; /* force small buffers */
        err = inflate(&d_stream, Z_NO_FLUSH);
        if (err == Z_STREAM_END) break;
        CHECK_ERR(err, "inflate");
    }

    err = inflateEnd(&d_stream);
    CHECK_ERR(err, "inflateEnd");

    if (strcmp((char*)uncompr, hello)) {
        fprintf(stderr, "bad inflate\n");
        exit(1);
    } else {
        printf("inflate(): %s\n", (char *)uncompr);
    }
}